

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall cp::PlanFootprints::whichWalkOrStep(PlanFootprints *this)

{
  Scalar *pSVar1;
  PlanFootprints *this_local;
  
  if ((*(int *)(this + 0x308) == 1) || (*(int *)(this + 0x308) == 2)) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    if ((*pSVar1 == 0.0) && (!NAN(*pSVar1))) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8)
                         );
      if ((*pSVar1 == 0.0) && (!NAN(*pSVar1))) {
        if (*(int *)this == 1) {
          *(undefined4 *)(this + 0x308) = 8;
        }
        *(undefined4 *)this = 2;
        return;
      }
    }
    if (*(int *)this == 2) {
      *(undefined4 *)(this + 0x308) = 9;
    }
    *(undefined4 *)this = 1;
  }
  return;
}

Assistant:

void PlanFootprints::whichWalkOrStep() {
  if (wstate != walk && wstate != step) {return;}
  if (step_vector.x() != 0.0 || step_vector.y() != 0.0) {
    if (whichwalk == step) {
      wstate = step2walk;
    }
    whichwalk = walk;
  } else {
    if (whichwalk == walk) {
      wstate = walk2step;
    }
    whichwalk = step;
  }
}